

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContext.h
# Opt level: O0

tuple<unsigned_char_*,_unsigned_long> __thiscall
SL::WS_LITE::WebSocketContext::Inflate(WebSocketContext *this,uchar *data,size_t data_len)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  pointer puVar6;
  void *pvVar7;
  ostream *poVar8;
  undefined4 in_ECX;
  _Head_base<0UL,_unsigned_char_*,_false> _Var9;
  tuple<unsigned_char_*,_unsigned_long> tVar10;
  pointer local_358;
  ostringstream local_350 [8];
  ostringstream buffersl134nonesd_1;
  size_t beforesize_1;
  size_t growsize_1;
  ostringstream local_1b8 [8];
  ostringstream buffersl134nonesd;
  size_t beforesize;
  size_t growsize;
  int err;
  size_t data_len_local;
  uchar *data_local;
  WebSocketContext *this_local;
  
  *(size_t *)(data + 0x18) = data_len;
  *(undefined4 *)(data + 0x20) = in_ECX;
  do {
    puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        (data + 0x10));
    *(pointer *)(data + 0x30) = puVar6;
    data[0x38] = '\0';
    data[0x39] = '\0';
    data[0x3a] = '\x10';
    data[0x3b] = '\0';
    iVar5 = inflate(data + 0x18,4);
    if (*(int *)(data + 0x20) == 0) break;
    uVar1 = *(uint *)(data + 0x38);
    *(size_t *)(data + 8) = (0x100000 - (ulong)uVar1) + *(long *)(data + 8);
    lVar2 = *(long *)(data + 8);
    pvVar7 = realloc(*(void **)data,*(size_t *)(data + 8));
    *(void **)data = pvVar7;
    if (*(long *)data == 0) {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      poVar8 = std::operator<<((ostream *)local_1b8,
                               "INFLATE MEMORY ALLOCATION ERROR!!! Tried to realloc ");
      std::ostream::operator<<(poVar8,*(ulong *)(data + 8));
      Log(ERROR_log_level,
          "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketContext.h"
          ,0x3e,"Inflate",(ostringstream *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
      tVar10 = returnemptyinflate(this);
      _Var9 = tVar10.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      goto LAB_0015e1d2;
    }
    lVar3 = *(long *)data;
    puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        (data + 0x10));
    memcpy((void *)(lVar3 + lVar2),puVar6,0x100000 - (ulong)uVar1);
    bVar4 = false;
    if (iVar5 == -5) {
      bVar4 = *(ulong *)(data + 8) <= *(ulong *)(data + 0x138);
    }
  } while (bVar4);
  inflateReset(data + 0x18);
  if (((iVar5 == -5) || (iVar5 == 0)) && (*(ulong *)(data + 8) <= *(ulong *)(data + 0x138))) {
    if (*(long *)(data + 8) == 0) {
      local_358 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                             (data + 0x10));
      tVar10 = std::make_tuple<unsigned_char*,unsigned_long>
                         (&this->InflateBuffer,(unsigned_long *)&local_358);
      _Var9 = tVar10.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    }
    else {
      uVar1 = *(uint *)(data + 0x38);
      *(size_t *)(data + 8) = (0x100000 - (ulong)uVar1) + *(long *)(data + 8);
      lVar2 = *(long *)(data + 8);
      pvVar7 = realloc(*(void **)data,*(size_t *)(data + 8));
      *(void **)data = pvVar7;
      if (*(long *)data == 0) {
        std::__cxx11::ostringstream::ostringstream(local_350);
        poVar8 = std::operator<<((ostream *)local_350,
                                 "INFLATE MEMORY ALLOCATION ERROR!!! Tried to realloc ");
        std::ostream::operator<<(poVar8,*(ulong *)(data + 8));
        Log(ERROR_log_level,
            "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketContext.h"
            ,0x4f,"Inflate",(ostringstream *)local_350);
        std::__cxx11::ostringstream::~ostringstream(local_350);
        tVar10 = returnemptyinflate(this);
        _Var9 = tVar10.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      }
      else {
        lVar3 = *(long *)data;
        puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            (data + 0x10));
        memcpy((void *)(lVar3 + lVar2),puVar6,0x100000 - (ulong)uVar1);
        tVar10 = std::make_tuple<unsigned_char*&,unsigned_long&>
                           (&this->InflateBuffer,(unsigned_long *)data);
        _Var9 = tVar10.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      }
    }
  }
  else {
    tVar10 = returnemptyinflate(this);
    _Var9 = tVar10.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  }
LAB_0015e1d2:
  tVar10.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = _Var9._M_head_impl;
  tVar10.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)this;
  return (tuple<unsigned_char_*,_unsigned_long>)
         tVar10.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>;
}

Assistant:

auto Inflate(unsigned char *data, size_t data_len)
        {
            InflationStream.next_in = (Bytef *)data;
            InflationStream.avail_in = data_len;

            int err;
            do {
                InflationStream.next_out = (Bytef *)TempInflateBuffer.get();
                InflationStream.avail_out = LARGE_BUFFER_SIZE;
                err = ::inflate(&InflationStream, Z_FINISH);
                if (!InflationStream.avail_in) {
                    break;
                }
                auto growsize = LARGE_BUFFER_SIZE - InflationStream.avail_out;
                InflateBufferSize += growsize;
                auto beforesize = InflateBufferSize;
                InflateBuffer = static_cast<unsigned char *>(realloc(InflateBuffer, InflateBufferSize));
                if (!InflateBuffer) {
                    SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "INFLATE MEMORY ALLOCATION ERROR!!! Tried to realloc " << InflateBufferSize);
                    return returnemptyinflate();
                }
                memcpy(InflateBuffer + beforesize, TempInflateBuffer.get(), growsize);
            } while (err == Z_BUF_ERROR && InflateBufferSize <= MaxPayload);

            inflateReset(&InflationStream);

            if ((err != Z_BUF_ERROR && err != Z_OK) || InflateBufferSize > MaxPayload) {
                return returnemptyinflate();
            }
            if (InflateBufferSize > 0) {
                auto growsize = LARGE_BUFFER_SIZE - InflationStream.avail_out;
                InflateBufferSize += growsize;
                auto beforesize = InflateBufferSize;
                InflateBuffer = static_cast<unsigned char *>(realloc(InflateBuffer, InflateBufferSize));
                if (!InflateBuffer) {
                    SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "INFLATE MEMORY ALLOCATION ERROR!!! Tried to realloc " << InflateBufferSize);
                    return returnemptyinflate();
                }
                memcpy(InflateBuffer + beforesize, TempInflateBuffer.get(), growsize);
                return std::make_tuple(InflateBuffer, InflateBufferSize);
            }
            return std::make_tuple(TempInflateBuffer.get(), LARGE_BUFFER_SIZE - (size_t)InflationStream.avail_out);
        }